

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmregex.cpp
# Opt level: O1

void __thiscall
CRegexParser::build_closure
          (CRegexParser *this,re_machine *new_machine,re_machine *sub,wchar_t specifier,int shortest
          )

{
  re_tuple_conflict *prVar1;
  uchar *puVar2;
  re_state_id rVar3;
  long lVar4;
  
  rVar3 = alloc_state(this);
  new_machine->init = rVar3;
  rVar3 = alloc_state(this);
  new_machine->final = rVar3;
  if (shortest == 0) {
    lVar4 = (long)new_machine->init;
    if (lVar4 != -1) {
      rVar3 = sub->init;
      goto LAB_002b4d31;
    }
  }
  else {
    lVar4 = (long)sub->final;
    if (lVar4 != -1) {
LAB_002b4d31:
      prVar1 = this->tuple_arr_ + lVar4;
      if (prVar1->next_state_1 == -1) {
        prVar1->typ = RE_EPSILON;
        (prVar1->info).ch = L'\0';
        prVar1->next_state_1 = rVar3;
      }
      else {
        prVar1->next_state_2 = rVar3;
      }
    }
  }
  if (specifier == L'?') {
LAB_002b4dad:
    if ((long)new_machine->init != -1) {
      rVar3 = new_machine->final;
      prVar1 = this->tuple_arr_ + new_machine->init;
      if (prVar1->next_state_1 == -1) {
        prVar1->typ = RE_EPSILON;
        (prVar1->info).ch = L'\0';
        prVar1->next_state_1 = rVar3;
      }
      else {
        prVar1->next_state_2 = rVar3;
      }
    }
    if (shortest != 0) {
      puVar2 = &this->tuple_arr_[new_machine->init].flags;
      *puVar2 = *puVar2 | 0x10;
      goto LAB_002b4df5;
    }
  }
  else {
    if ((long)sub->final != -1) {
      rVar3 = sub->init;
      prVar1 = this->tuple_arr_ + sub->final;
      if (prVar1->next_state_1 == -1) {
        prVar1->typ = RE_EPSILON;
        (prVar1->info).ch = L'\0';
        prVar1->next_state_1 = rVar3;
      }
      else {
        prVar1->next_state_2 = rVar3;
      }
    }
    if (shortest != 0) {
      puVar2 = &this->tuple_arr_[sub->final].flags;
      *puVar2 = *puVar2 | 0x10;
    }
    if (specifier != L'+') goto LAB_002b4dad;
LAB_002b4df5:
    if (shortest != 0) {
      lVar4 = (long)new_machine->init;
      if (lVar4 == -1) {
        return;
      }
      rVar3 = sub->init;
      goto LAB_002b4e15;
    }
  }
  lVar4 = (long)sub->final;
  if (lVar4 == -1) {
    return;
  }
  rVar3 = new_machine->final;
LAB_002b4e15:
  prVar1 = this->tuple_arr_ + lVar4;
  if (prVar1->next_state_1 == -1) {
    prVar1->typ = RE_EPSILON;
    (prVar1->info).ch = L'\0';
    prVar1->next_state_1 = rVar3;
  }
  else {
    prVar1->next_state_2 = rVar3;
  }
  return;
}

Assistant:

void CRegexParser::build_closure(re_machine *new_machine, re_machine *sub,
                                 wchar_t specifier, int shortest)
{
    /* initialize the new machine */
    init_machine(new_machine);

    /* 
     *   Set up an epsilon transition from our initial state to the
     *   submachine's initial state.  However, if we're in shortest mode,
     *   wait to do this until after we've generated the rest of the
     *   machine, and instead set up the transition from the submachine's
     *   final state to our final state.  The order is important because
     *   we will favor the first branch taken when we find two matches of
     *   equal total length; hence we want to make the branch that will
     *   give us either the longest match or shortest match for this
     *   closure first, depending on which way we want to go.  
     */
    if (!shortest)
        set_trans(new_machine->init, sub->init, RE_EPSILON, 0);
    else
        set_trans(sub->final, new_machine->final, RE_EPSILON, 0);

    /*
     *   If this is an unbounded closure ('*' or '+', but not '?'), set up
     *   the loop transition that takes us from the new machine's final
     *   state back to its initial state.  We don't do this on the
     *   zero-or-one closure, because we can only match the expression
     *   once.  
     */
    if (specifier != '?')
    {
        /* set the transition */
        set_trans(sub->final, sub->init, RE_EPSILON, 0);

        /* if we have a 'shortest' modifier, flag it in this branch */
        if (shortest)
            tuple_arr_[sub->final].flags |= RE_STATE_SHORTEST;
    }

    /*
     *   If this is a zero-or-one closure or a zero-or-more closure, set
     *   up an epsilon transition from our initial state to our final
     *   state, since we can skip the entire subexpression.  We don't do
     *   this on the one-or-more closure, because we can't skip the
     *   subexpression in this case.  
     */
    if (specifier != '+')
    {
        /* set the transition */
        set_trans(new_machine->init, new_machine->final, RE_EPSILON, 0);

        /* if we have a 'shortest' modifier, flag it in this branch */
        if (shortest)
            tuple_arr_[new_machine->init].flags |= RE_STATE_SHORTEST;
    }

    /* 
     *   Set up a transition from the submachine's final state to our
     *   final state.  We waited until here to ensure proper ordering for
     *   longest-preferred.  If we're in shortest-preferred mode, though,
     *   set up the initial transition to the submachine instead.  
     */
    if (!shortest)
        set_trans(sub->final, new_machine->final, RE_EPSILON, 0);
    else
        set_trans(new_machine->init, sub->init, RE_EPSILON, 0);
}